

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate2.cpp
# Opt level: O2

void __thiscall
qclab::qgates::QGate2<std::complex<double>_>::apply
          (QGate2<std::complex<double>_> *this,Side side,Op op,int nbQubits,
          SquareMatrix<std::complex<double>_> *matrix,int offset)

{
  long lVar1;
  complex<double> *pcVar2;
  byte bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint __line;
  int iVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  byte bVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  char *__assertion;
  int iVar21;
  int64_t k;
  long lVar22;
  long lVar23;
  long lVar24;
  bool bVar25;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 extraout_XMM0_Da_09;
  undefined4 extraout_XMM0_Da_10;
  undefined4 extraout_XMM0_Da_11;
  undefined4 extraout_XMM0_Da_12;
  undefined4 extraout_XMM0_Da_13;
  undefined4 extraout_XMM0_Da_14;
  undefined4 extraout_XMM0_Da_15;
  undefined4 extraout_XMM0_Da_16;
  undefined4 extraout_XMM0_Da_17;
  undefined4 extraout_XMM0_Da_18;
  undefined4 extraout_XMM0_Da_19;
  undefined4 extraout_XMM0_Da_20;
  undefined4 extraout_XMM0_Da_21;
  undefined4 extraout_XMM0_Da_22;
  undefined4 extraout_XMM0_Da_23;
  undefined4 extraout_XMM0_Da_24;
  undefined4 extraout_XMM0_Da_25;
  undefined4 extraout_XMM0_Da_26;
  undefined4 extraout_XMM0_Da_27;
  undefined4 extraout_XMM0_Da_28;
  undefined4 extraout_XMM0_Da_29;
  undefined4 extraout_XMM0_Da_30;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Db_11;
  undefined4 extraout_XMM0_Db_12;
  undefined4 extraout_XMM0_Db_13;
  undefined4 extraout_XMM0_Db_14;
  undefined4 extraout_XMM0_Db_15;
  undefined4 extraout_XMM0_Db_16;
  undefined4 extraout_XMM0_Db_17;
  undefined4 extraout_XMM0_Db_18;
  undefined4 extraout_XMM0_Db_19;
  undefined4 extraout_XMM0_Db_20;
  undefined4 extraout_XMM0_Db_21;
  undefined4 extraout_XMM0_Db_22;
  undefined4 extraout_XMM0_Db_23;
  undefined4 extraout_XMM0_Db_24;
  undefined4 extraout_XMM0_Db_25;
  undefined4 extraout_XMM0_Db_26;
  undefined4 extraout_XMM0_Db_27;
  undefined4 extraout_XMM0_Db_28;
  undefined4 extraout_XMM0_Db_29;
  undefined4 extraout_XMM0_Db_30;
  double in_XMM1_Qa;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  SquareMatrix<std::complex<double>_> mat2;
  complex<double> x1;
  undefined8 local_f8;
  undefined8 local_d8;
  complex<double> x4;
  complex<double> x3;
  complex<double> x2;
  SquareMatrix<std::complex<double>_> local_58;
  vector<int,_std::allocator<int>_> qubits;
  
  if (nbQubits < 2) {
    __assertion = "nbQubits >= 2";
    __line = 0x23;
  }
  else {
    bVar16 = (byte)nbQubits;
    if (matrix->size_ == (long)(1 << (bVar16 & 0x1f))) {
      (*(this->super_QObject<std::complex<double>_>)._vptr_QObject[5])(&qubits,this);
      iVar12 = *qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_start + offset;
      *qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
           = iVar12;
      iVar21 = offset + qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[1];
      qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [1] = iVar21;
      if (iVar12 < nbQubits) {
        if (iVar21 < nbQubits) {
          if (iVar12 + 1 == iVar21) {
            (*(this->super_QObject<std::complex<double>_>)._vptr_QObject[7])(&mat2,this);
            dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<double>>>(op,&mat2);
            if (side == Left) {
              if (nbQubits == 2) {
                dense::SquareMatrix<std::complex<double>_>::operator*=(matrix,&mat2);
              }
              else {
                bVar3 = (byte)*qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start & 0x1f;
                bVar16 = ~(byte)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[1] + bVar16 & 0x1f;
                lVar13 = (long)(1 << bVar16);
                uVar20 = (ulong)(uint)(0 << bVar16);
                lVar18 = 0;
                if (0 < lVar13) {
                  lVar18 = lVar13;
                }
                uVar19 = (ulong)(uint)(1 << bVar3);
                if (1 << bVar3 < 1) {
                  uVar19 = uVar20;
                }
                for (; (long)uVar20 < matrix->size_; uVar20 = uVar20 + 1) {
                  lVar23 = 0;
                  uVar14 = 0;
                  while( true ) {
                    lVar17 = lVar18;
                    lVar22 = lVar23;
                    if (uVar14 == uVar19) break;
                    while (bVar25 = lVar17 != 0, lVar17 = lVar17 + -1, bVar25) {
                      lVar24 = lVar13 * 2 + lVar22;
                      lVar15 = lVar13 * 3 + lVar22;
                      lVar1 = matrix->size_;
                      pcVar2 = (matrix->data_)._M_t.
                               super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                               .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                      x1._M_value._0_8_ = *(undefined8 *)pcVar2[lVar1 * lVar22 + uVar20]._M_value;
                      x1._M_value._8_8_ =
                           *(undefined8 *)(pcVar2[lVar1 * lVar22 + uVar20]._M_value + 8);
                      x2._M_value._0_8_ =
                           *(undefined8 *)pcVar2[lVar1 * (lVar13 + lVar22) + uVar20]._M_value;
                      x2._M_value._8_8_ =
                           *(undefined8 *)(pcVar2[lVar1 * (lVar13 + lVar22) + uVar20]._M_value + 8);
                      x3._M_value._0_8_ = *(undefined8 *)pcVar2[lVar1 * lVar24 + uVar20]._M_value;
                      x3._M_value._8_8_ =
                           *(undefined8 *)(pcVar2[lVar1 * lVar24 + uVar20]._M_value + 8);
                      x4._M_value._0_8_ = *(undefined8 *)pcVar2[lVar1 * lVar15 + uVar20]._M_value;
                      x4._M_value._8_8_ =
                           *(undefined8 *)(pcVar2[lVar1 * lVar15 + uVar20]._M_value + 8);
                      std::operator*((complex<double> *)
                                     mat2.data_._M_t.
                                     super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                     .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                     _M_head_impl,&x1);
                      local_f8 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
                      dVar26 = in_XMM1_Qa;
                      std::operator*((complex<double> *)
                                     ((long)mat2.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                            .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                            _M_head_impl + 0x10),&x2);
                      dVar27 = dVar26;
                      std::operator*((complex<double> *)
                                     ((long)mat2.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                            .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                            _M_head_impl + 0x20),&x3);
                      dVar28 = dVar27;
                      std::operator*((complex<double> *)
                                     ((long)mat2.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                            .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                            _M_head_impl + 0x30),&x4);
                      dVar26 = dVar28 + dVar27 + dVar26 + in_XMM1_Qa;
                      auVar4._8_4_ = SUB84(dVar26,0);
                      auVar4._0_8_ = (double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02) +
                                     (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01) +
                                     (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00) +
                                     local_f8;
                      auVar4._12_4_ = (int)((ulong)dVar26 >> 0x20);
                      *(undefined1 (*) [16])
                       (matrix->data_)._M_t.
                       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                       .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                       [matrix->size_ * lVar22 + uVar20]._M_value = auVar4;
                      std::operator*((complex<double> *)
                                     (mat2.size_ * 0x10 +
                                     (long)mat2.data_._M_t.
                                           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                           .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                           _M_head_impl),&x1);
                      local_f8 = (double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03);
                      dVar26 = dVar28;
                      std::operator*((complex<double> *)
                                     ((long)mat2.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                            .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                            _M_head_impl + mat2.size_ * 0x10 + 0x10),&x2);
                      dVar27 = dVar26;
                      std::operator*((complex<double> *)
                                     ((long)mat2.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                            .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                            _M_head_impl + mat2.size_ * 0x10 + 0x20),&x3);
                      dVar29 = dVar27;
                      std::operator*((complex<double> *)
                                     ((long)mat2.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                            .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                            _M_head_impl + mat2.size_ * 0x10 + 0x30),&x4);
                      dVar26 = dVar29 + dVar27 + dVar26 + dVar28;
                      auVar5._8_4_ = SUB84(dVar26,0);
                      auVar5._0_8_ = (double)CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06) +
                                     (double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05) +
                                     (double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04) +
                                     local_f8;
                      auVar5._12_4_ = (int)((ulong)dVar26 >> 0x20);
                      *(undefined1 (*) [16])
                       (matrix->data_)._M_t.
                       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                       .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                       [(lVar13 + lVar22) * matrix->size_ + uVar20]._M_value = auVar5;
                      std::operator*((complex<double> *)
                                     (mat2.size_ * 0x20 +
                                     (long)mat2.data_._M_t.
                                           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                           .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                           _M_head_impl),&x1);
                      local_f8 = (double)CONCAT44(extraout_XMM0_Db_07,extraout_XMM0_Da_07);
                      dVar26 = dVar29;
                      std::operator*((complex<double> *)
                                     ((long)mat2.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                            .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                            _M_head_impl + mat2.size_ * 0x20 + 0x10),&x2);
                      dVar27 = dVar26;
                      std::operator*((complex<double> *)
                                     ((long)mat2.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                            .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                            _M_head_impl + mat2.size_ * 0x20 + 0x20),&x3);
                      dVar28 = dVar27;
                      std::operator*((complex<double> *)
                                     ((long)mat2.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                            .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                            _M_head_impl + mat2.size_ * 0x20 + 0x30),&x4);
                      dVar26 = dVar28 + dVar27 + dVar26 + dVar29;
                      auVar6._8_4_ = SUB84(dVar26,0);
                      auVar6._0_8_ = (double)CONCAT44(extraout_XMM0_Db_10,extraout_XMM0_Da_10) +
                                     (double)CONCAT44(extraout_XMM0_Db_09,extraout_XMM0_Da_09) +
                                     (double)CONCAT44(extraout_XMM0_Db_08,extraout_XMM0_Da_08) +
                                     local_f8;
                      auVar6._12_4_ = (int)((ulong)dVar26 >> 0x20);
                      *(undefined1 (*) [16])
                       (matrix->data_)._M_t.
                       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                       .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                       [lVar24 * matrix->size_ + uVar20]._M_value = auVar6;
                      std::operator*((complex<double> *)
                                     (mat2.size_ * 0x30 +
                                     (long)mat2.data_._M_t.
                                           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                           .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                           _M_head_impl),&x1);
                      local_f8 = (double)CONCAT44(extraout_XMM0_Db_11,extraout_XMM0_Da_11);
                      dVar26 = dVar28;
                      std::operator*((complex<double> *)
                                     ((long)mat2.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                            .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                            _M_head_impl + mat2.size_ * 0x30 + 0x10),&x2);
                      dVar27 = dVar26;
                      std::operator*((complex<double> *)
                                     ((long)mat2.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                            .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                            _M_head_impl + mat2.size_ * 0x30 + 0x20),&x3);
                      in_XMM1_Qa = dVar27;
                      std::operator*((complex<double> *)
                                     ((long)mat2.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                            .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                            _M_head_impl + mat2.size_ * 0x30 + 0x30),&x4);
                      dVar26 = in_XMM1_Qa + dVar27 + dVar26 + dVar28;
                      auVar7._8_4_ = SUB84(dVar26,0);
                      auVar7._0_8_ = (double)CONCAT44(extraout_XMM0_Db_14,extraout_XMM0_Da_14) +
                                     (double)CONCAT44(extraout_XMM0_Db_13,extraout_XMM0_Da_13) +
                                     (double)CONCAT44(extraout_XMM0_Db_12,extraout_XMM0_Da_12) +
                                     local_f8;
                      auVar7._12_4_ = (int)((ulong)dVar26 >> 0x20);
                      *(undefined1 (*) [16])
                       (matrix->data_)._M_t.
                       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                       .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                       [lVar15 * matrix->size_ + uVar20]._M_value = auVar7;
                      lVar22 = lVar22 + 1;
                    }
                    uVar14 = uVar14 + 1;
                    lVar23 = lVar23 + lVar13 * 4;
                  }
                }
              }
            }
            else if (nbQubits == 2) {
              dense::SquareMatrix<std::complex<double>_>::SquareMatrix(&local_58,&mat2);
              dense::operator*((dense *)&x1,&local_58,matrix);
              dense::SquareMatrix<std::complex<double>_>::operator=
                        (matrix,(SquareMatrix<std::complex<double>_> *)&x1);
              std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>
              ::~unique_ptr((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>
                             *)(x1._M_value + 8));
              std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>
              ::~unique_ptr(&local_58.data_);
            }
            else {
              bVar3 = (byte)*qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start & 0x1f;
              bVar16 = ~(byte)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[1] + bVar16 & 0x1f;
              lVar13 = (long)(1 << bVar16);
              uVar20 = (ulong)(uint)(0 << bVar16);
              lVar18 = 0;
              if (0 < lVar13) {
                lVar18 = lVar13;
              }
              uVar19 = (ulong)(uint)(1 << bVar3);
              if (1 << bVar3 < 1) {
                uVar19 = uVar20;
              }
              for (lVar23 = 0; lVar23 < matrix->size_; lVar23 = lVar23 + 1) {
                lVar17 = 0;
                uVar14 = 0;
                while( true ) {
                  lVar22 = lVar17;
                  lVar24 = lVar18;
                  if (uVar14 == uVar19) break;
                  while (bVar25 = lVar24 != 0, lVar24 = lVar24 + -1, bVar25) {
                    lVar15 = matrix->size_ * uVar20;
                    pcVar2 = (matrix->data_)._M_t.
                             super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                             .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                    x1._M_value._0_8_ = *(undefined8 *)(pcVar2->_M_value + lVar22 + lVar15);
                    x1._M_value._8_8_ =
                         *(undefined8 *)((long)(pcVar2->_M_value + lVar22 + lVar15) + 8);
                    lVar15 = lVar22 + lVar15;
                    x2._M_value._0_8_ = *(undefined8 *)(pcVar2[lVar13]._M_value + lVar15);
                    x2._M_value._8_8_ =
                         *(undefined8 *)((long)(pcVar2[lVar13]._M_value + lVar15) + 8);
                    x3._M_value._0_8_ = *(undefined8 *)(pcVar2[lVar13 * 2]._M_value + lVar15);
                    x3._M_value._8_8_ =
                         *(undefined8 *)((long)(pcVar2[lVar13 * 2]._M_value + lVar15) + 8);
                    x4._M_value._0_8_ = *(undefined8 *)(pcVar2[lVar13 * 3]._M_value + lVar15);
                    x4._M_value._8_8_ =
                         *(undefined8 *)((long)(pcVar2[lVar13 * 3]._M_value + lVar15) + 8);
                    std::operator*((complex<double> *)
                                   mat2.data_._M_t.
                                   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                   .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl,&x1);
                    dVar26 = in_XMM1_Qa;
                    std::operator*((complex<double> *)
                                   (mat2.size_ * 0x10 +
                                   (long)mat2.data_._M_t.
                                         super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                         .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                         _M_head_impl),&x2);
                    dVar27 = dVar26;
                    std::operator*((complex<double> *)
                                   (mat2.size_ * 0x20 +
                                   (long)mat2.data_._M_t.
                                         super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                         .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                         _M_head_impl),&x3);
                    local_d8 = (double)CONCAT44(extraout_XMM0_Db_17,extraout_XMM0_Da_17);
                    dVar28 = dVar27;
                    std::operator*((complex<double> *)
                                   (mat2.size_ * 0x30 +
                                   (long)mat2.data_._M_t.
                                         super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                         .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                         _M_head_impl),&x4);
                    dVar26 = dVar28 + dVar27 + dVar26 + in_XMM1_Qa;
                    auVar8._8_4_ = SUB84(dVar26,0);
                    auVar8._0_8_ = (double)CONCAT44(extraout_XMM0_Db_18,extraout_XMM0_Da_18) +
                                   local_d8 +
                                   (double)CONCAT44(extraout_XMM0_Db_16,extraout_XMM0_Da_16) +
                                   (double)CONCAT44(extraout_XMM0_Db_15,extraout_XMM0_Da_15);
                    auVar8._12_4_ = (int)((ulong)dVar26 >> 0x20);
                    *(undefined1 (*) [16])
                     (((matrix->data_)._M_t.
                       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                       .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl)->_M_value
                     + lVar22 + matrix->size_ * uVar20) = auVar8;
                    std::operator*((complex<double> *)
                                   ((long)mat2.data_._M_t.
                                          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                          .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                          _M_head_impl + 0x10),&x1);
                    dVar26 = dVar28;
                    std::operator*((complex<double> *)
                                   ((long)mat2.data_._M_t.
                                          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                          .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                          _M_head_impl + mat2.size_ * 0x10 + 0x10),&x2);
                    dVar27 = dVar26;
                    std::operator*((complex<double> *)
                                   ((long)mat2.data_._M_t.
                                          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                          .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                          _M_head_impl + mat2.size_ * 0x20 + 0x10),&x3);
                    local_d8 = (double)CONCAT44(extraout_XMM0_Db_21,extraout_XMM0_Da_21);
                    dVar29 = dVar27;
                    std::operator*((complex<double> *)
                                   ((long)mat2.data_._M_t.
                                          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                          .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                          _M_head_impl + mat2.size_ * 0x30 + 0x10),&x4);
                    dVar26 = dVar29 + dVar27 + dVar26 + dVar28;
                    auVar9._8_4_ = SUB84(dVar26,0);
                    auVar9._0_8_ = (double)CONCAT44(extraout_XMM0_Db_22,extraout_XMM0_Da_22) +
                                   local_d8 +
                                   (double)CONCAT44(extraout_XMM0_Db_20,extraout_XMM0_Da_20) +
                                   (double)CONCAT44(extraout_XMM0_Db_19,extraout_XMM0_Da_19);
                    auVar9._12_4_ = (int)((ulong)dVar26 >> 0x20);
                    *(undefined1 (*) [16])
                     ((matrix->data_)._M_t.
                      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                      .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl[lVar13].
                      _M_value + lVar22 + matrix->size_ * uVar20) = auVar9;
                    std::operator*((complex<double> *)
                                   ((long)mat2.data_._M_t.
                                          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                          .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                          _M_head_impl + 0x20),&x1);
                    dVar26 = dVar29;
                    std::operator*((complex<double> *)
                                   ((long)mat2.data_._M_t.
                                          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                          .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                          _M_head_impl + mat2.size_ * 0x10 + 0x20),&x2);
                    dVar27 = dVar26;
                    std::operator*((complex<double> *)
                                   ((long)mat2.data_._M_t.
                                          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                          .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                          _M_head_impl + mat2.size_ * 0x20 + 0x20),&x3);
                    local_d8 = (double)CONCAT44(extraout_XMM0_Db_25,extraout_XMM0_Da_25);
                    dVar28 = dVar27;
                    std::operator*((complex<double> *)
                                   ((long)mat2.data_._M_t.
                                          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                          .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                          _M_head_impl + mat2.size_ * 0x30 + 0x20),&x4);
                    dVar26 = dVar28 + dVar27 + dVar26 + dVar29;
                    auVar10._8_4_ = SUB84(dVar26,0);
                    auVar10._0_8_ =
                         (double)CONCAT44(extraout_XMM0_Db_26,extraout_XMM0_Da_26) +
                         local_d8 +
                         (double)CONCAT44(extraout_XMM0_Db_24,extraout_XMM0_Da_24) +
                         (double)CONCAT44(extraout_XMM0_Db_23,extraout_XMM0_Da_23);
                    auVar10._12_4_ = (int)((ulong)dVar26 >> 0x20);
                    *(undefined1 (*) [16])
                     ((matrix->data_)._M_t.
                      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                      .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl[lVar13 * 2]
                      ._M_value + lVar22 + matrix->size_ * uVar20) = auVar10;
                    std::operator*((complex<double> *)
                                   ((long)mat2.data_._M_t.
                                          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                          .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                          _M_head_impl + 0x30),&x1);
                    dVar26 = dVar28;
                    std::operator*((complex<double> *)
                                   ((long)mat2.data_._M_t.
                                          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                          .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                          _M_head_impl + mat2.size_ * 0x10 + 0x30),&x2);
                    dVar27 = dVar26;
                    std::operator*((complex<double> *)
                                   ((long)mat2.data_._M_t.
                                          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                          .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                          _M_head_impl + mat2.size_ * 0x20 + 0x30),&x3);
                    local_d8 = (double)CONCAT44(extraout_XMM0_Db_29,extraout_XMM0_Da_29);
                    in_XMM1_Qa = dVar27;
                    std::operator*((complex<double> *)
                                   ((long)mat2.data_._M_t.
                                          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                          .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                          _M_head_impl + mat2.size_ * 0x30 + 0x30),&x4);
                    dVar26 = in_XMM1_Qa + dVar27 + dVar26 + dVar28;
                    auVar11._8_4_ = SUB84(dVar26,0);
                    auVar11._0_8_ =
                         (double)CONCAT44(extraout_XMM0_Db_30,extraout_XMM0_Da_30) +
                         local_d8 +
                         (double)CONCAT44(extraout_XMM0_Db_28,extraout_XMM0_Da_28) +
                         (double)CONCAT44(extraout_XMM0_Db_27,extraout_XMM0_Da_27);
                    auVar11._12_4_ = (int)((ulong)dVar26 >> 0x20);
                    *(undefined1 (*) [16])
                     ((matrix->data_)._M_t.
                      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                      .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl[lVar13 * 3]
                      ._M_value + lVar22 + matrix->size_ * uVar20) = auVar11;
                    lVar22 = lVar22 + 0x10;
                  }
                  uVar14 = uVar14 + 1;
                  lVar17 = lVar17 + lVar13 * 0x40;
                }
                uVar20 = uVar20 + 0x10;
              }
            }
            std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
            ~unique_ptr(&mat2.data_);
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      (&qubits.super__Vector_base<int,_std::allocator<int>_>);
            return;
          }
          __assertion = "qubits[0] + 1 == qubits[1]";
          __line = 0x29;
          goto LAB_0038fd10;
        }
        __assertion = "qubits[1] < nbQubits";
      }
      else {
        __assertion = "qubits[0] < nbQubits";
      }
      __line = 0x28;
    }
    else {
      __assertion = "matrix.size() == 1 << nbQubits";
      __line = 0x24;
    }
  }
LAB_0038fd10:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate2.cpp"
                ,__line,
                "virtual void qclab::qgates::QGate2<std::complex<double>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<double>]"
               );
}

Assistant:

void QGate2< T >::apply( Side side , Op op , const int nbQubits ,
                           qclab::dense::SquareMatrix< T >& matrix ,
                           const int offset ) const {
    assert( nbQubits >= 2 ) ;
    assert( matrix.size() == 1 << nbQubits ) ;
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    assert( qubits[0] < nbQubits ) ; assert( qubits[1] < nbQubits ) ;
    assert( qubits[0] + 1 == qubits[1] ) ;  // nearest neighbor qubtis
    // operation
    qclab::dense::SquareMatrix< T >  mat2 = this->matrix() ;
    qclab::dense::operateInPlace( op , mat2 ) ;
    // side
    if ( side == Side::Left ) {
      if ( nbQubits == 2 ) {
        matrix *= mat2 ;
      } else {
        // matrix *= kron( Ileft , mat2 , Iright )
        const int64_t nLeft  = 1 << qubits[0] ;
        const int64_t nRight = 1 << ( nbQubits - qubits[1] - 1 ) ;
        #pragma omp parallel for
        for ( int64_t i = 0; i < matrix.rows(); i++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t j = 0; j < nRight; j++ ) {
              const int64_t j1 = j + 4 * k * nRight ;
              const int64_t j2 = j1 + nRight ;
              const int64_t j3 = j2 + nRight ;
              const int64_t j4 = j3 + nRight ;
              const T x1 = matrix(i,j1) ;
              const T x2 = matrix(i,j2) ;
              const T x3 = matrix(i,j3) ;
              const T x4 = matrix(i,j4) ;
              matrix(i,j1) = mat2(0,0) * x1 + mat2(1,0) * x2 +
                             mat2(2,0) * x3 + mat2(3,0) * x4 ;
              matrix(i,j2) = mat2(0,1) * x1 + mat2(1,1) * x2 +
                             mat2(2,1) * x3 + mat2(3,1) * x4 ;
              matrix(i,j3) = mat2(0,2) * x1 + mat2(1,2) * x2 +
                             mat2(2,2) * x3 + mat2(3,2) * x4 ;
              matrix(i,j4) = mat2(0,3) * x1 + mat2(1,3) * x2 +
                             mat2(2,3) * x3 + mat2(3,3) * x4 ;
            }
          }
        }
      }
    } else {
      if ( nbQubits == 2 ) {
        matrix = mat2 * matrix ;
      } else {
        // matrix = kron( Ileft , mat2 , Iright ) * matrix
        const int64_t nLeft  = 1 << qubits[0] ;
        const int64_t nRight = 1 << ( nbQubits - qubits[1] - 1 ) ;
        #pragma omp parallel for
        for ( int64_t j = 0; j < matrix.cols(); j++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t i = 0; i < nRight; i++ ) {
              const int64_t i1 = i + 4 * k * nRight ;
              const int64_t i2 = i1 + nRight ;
              const int64_t i3 = i2 + nRight ;
              const int64_t i4 = i3 + nRight ;
              const T x1 = matrix(i1,j) ;
              const T x2 = matrix(i2,j) ;
              const T x3 = matrix(i3,j) ;
              const T x4 = matrix(i4,j) ;
              matrix(i1,j) = mat2(0,0) * x1 + mat2(0,1) * x2 +
                             mat2(0,2) * x3 + mat2(0,3) * x4 ;
              matrix(i2,j) = mat2(1,0) * x1 + mat2(1,1) * x2 +
                             mat2(1,2) * x3 + mat2(1,3) * x4 ;
              matrix(i3,j) = mat2(2,0) * x1 + mat2(2,1) * x2 +
                             mat2(2,2) * x3 + mat2(2,3) * x4 ;
              matrix(i4,j) = mat2(3,0) * x1 + mat2(3,1) * x2 +
                             mat2(3,2) * x3 + mat2(3,3) * x4 ;
            }
          }
        }
      }
    }
  }